

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vec3f * barycentric(vec3f *__return_storage_ptr__,vec3i A,vec3i B,vec3i C,vec3i P)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  size_t i;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  vec3f s [2];
  vec<3UL,_int> local_50;
  vec<3UL,_int> local_40;
  
  local_50.z = B.z;
  local_50._0_8_ = B._0_8_;
  local_40.z = A.z;
  local_40._0_8_ = A._0_8_;
  pdVar3 = &s[1].z;
  s[1].y = 0.0;
  s[1].z = 0.0;
  s[0].z = 0.0;
  s[1].x = 0.0;
  s[0].x = 0.0;
  s[0].y = 0.0;
  for (i = 1; i != 0xffffffffffffffff; i = i - 1) {
    piVar2 = vec<3UL,_int>::operator[](&C,i);
    iVar1 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[](&local_40,i);
    ((vec3f *)(pdVar3 + -2))->x = (double)(iVar1 - *piVar2);
    piVar2 = vec<3UL,_int>::operator[](&local_50,i);
    iVar1 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[](&local_40,i);
    pdVar3[-1] = (double)(iVar1 - *piVar2);
    piVar2 = vec<3UL,_int>::operator[](&local_40,i);
    iVar1 = *piVar2;
    piVar2 = vec<3UL,_int>::operator[](&P,i);
    *pdVar3 = (double)(iVar1 - *piVar2);
    pdVar3 = pdVar3 + -3;
  }
  dVar6 = s[0].x * s[1].y - s[1].x * s[0].y;
  if (ABS(dVar6) <= 0.01) {
    dVar7 = -1.0;
    auVar5 = _DAT_00106020;
  }
  else {
    auVar4._0_8_ = s[1].x * s[0].z - s[1].z * s[0].x;
    auVar4._8_8_ = s[0].y * s[1].z - s[1].y * s[0].z;
    dVar7 = 1.0 - (auVar4._8_8_ + auVar4._0_8_) / dVar6;
    auVar5._8_8_ = dVar6;
    auVar5._0_8_ = dVar6;
    auVar5 = divpd(auVar4,auVar5);
  }
  __return_storage_ptr__->x = dVar7;
  __return_storage_ptr__->y = (double)auVar5._0_8_;
  __return_storage_ptr__->z = (double)auVar5._8_8_;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec3i A, vec3i B, vec3i C, vec3i P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = static_cast<double>(C[i] - A[i]);
        s[i][1] = static_cast<double>(B[i] - A[i]);
        s[i][2] = static_cast<double>(A[i] - P[i]);
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) >
        1e-2)  // dont forget that u[2] is integer. If it is zero then triangle ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown away
                             // by the rasterizer
}